

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcorolib.c
# Opt level: O0

int auxresume(lua_State *L,lua_State *co,int narg)

{
  int iVar1;
  int nres;
  int status;
  int narg_local;
  lua_State *co_local;
  lua_State *L_local;
  
  iVar1 = lua_checkstack(co,narg);
  if (iVar1 == 0) {
    lua_pushstring(L,"too many arguments to resume");
    L_local._4_4_ = -1;
  }
  else {
    iVar1 = lua_status(co);
    if ((iVar1 == 0) && (iVar1 = lua_gettop(co), iVar1 == 0)) {
      lua_pushstring(L,"cannot resume dead coroutine");
      return -1;
    }
    lua_xmove(L,co,narg);
    iVar1 = lua_resume(co,L,narg);
    if ((iVar1 == 0) || (iVar1 == 1)) {
      L_local._4_4_ = lua_gettop(co);
      iVar1 = lua_checkstack(L,L_local._4_4_ + 1);
      if (iVar1 == 0) {
        lua_settop(co,-1 - L_local._4_4_);
        lua_pushstring(L,"too many results to resume");
        L_local._4_4_ = -1;
      }
      else {
        lua_xmove(co,L,L_local._4_4_);
      }
    }
    else {
      lua_xmove(co,L,1);
      L_local._4_4_ = -1;
    }
  }
  return L_local._4_4_;
}

Assistant:

static int auxresume (lua_State *L, lua_State *co, int narg) {
  int status;
  if (!lua_checkstack(co, narg)) {
    lua_pushliteral(L, "too many arguments to resume");
    return -1;  /* error flag */
  }
  if (lua_status(co) == LUA_OK && lua_gettop(co) == 0) {
    lua_pushliteral(L, "cannot resume dead coroutine");
    return -1;  /* error flag */
  }
  lua_xmove(L, co, narg);
  status = lua_resume(co, L, narg);
  if (status == LUA_OK || status == LUA_YIELD) {
    int nres = lua_gettop(co);
    if (!lua_checkstack(L, nres + 1)) {
      lua_pop(co, nres);  /* remove results anyway */
      lua_pushliteral(L, "too many results to resume");
      return -1;  /* error flag */
    }
    lua_xmove(co, L, nres);  /* move yielded values */
    return nres;
  }
  else {
    lua_xmove(co, L, 1);  /* move error message */
    return -1;  /* error flag */
  }
}